

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter_range.cpp
# Opt level: O1

int reducer(int state,Action action)

{
  if (action.type == DECREMENT) {
    state = state - action.range;
  }
  else if (action.type == INCREMENT) {
    return action.range + state;
  }
  return state;
}

Assistant:

int reducer(int state, Action action) {
	switch(action.type) {
		case INCREMENT:
			return state + action.range;

		case DECREMENT:
			return state - action.range;

		default:
			return state;
	}
}